

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O3

StatementProperties * __thiscall
duckdb::PreparedStatement::GetStatementProperties
          (StatementProperties *__return_storage_ptr__,PreparedStatement *this)

{
  size_t sVar1;
  idx_t iVar2;
  undefined4 uVar3;
  bool bVar4;
  bool bVar5;
  StatementReturnType SVar6;
  PreparedStatementData *pPVar7;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_true>_>_>
  local_28;
  
  pPVar7 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&this->data);
  (__return_storage_ptr__->read_databases)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->read_databases)._M_h._M_bucket_count =
       (pPVar7->properties).read_databases._M_h._M_bucket_count;
  (__return_storage_ptr__->read_databases)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->read_databases)._M_h._M_element_count =
       (pPVar7->properties).read_databases._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(pPVar7->properties).read_databases._M_h._M_rehash_policy.field_0x4;
  sVar1 = (pPVar7->properties).read_databases._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->read_databases)._M_h._M_rehash_policy._M_max_load_factor =
       (pPVar7->properties).read_databases._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->read_databases)._M_h._M_rehash_policy.field_0x4 = uVar3;
  (__return_storage_ptr__->read_databases)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (__return_storage_ptr__->read_databases)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_28._M_h = (__hashtable_alloc *)__return_storage_ptr__;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)__return_storage_ptr__,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::StatementProperties::CatalogIdentity>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)&pPVar7->properties,&local_28);
  local_28._M_h = (__hashtable_alloc *)&__return_storage_ptr__->modified_databases;
  (__return_storage_ptr__->modified_databases)._M_h._M_buckets = (__buckets_ptr)0x0;
  (__return_storage_ptr__->modified_databases)._M_h._M_bucket_count =
       (pPVar7->properties).modified_databases._M_h._M_bucket_count;
  (__return_storage_ptr__->modified_databases)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->modified_databases)._M_h._M_element_count =
       (pPVar7->properties).modified_databases._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(pPVar7->properties).modified_databases._M_h._M_rehash_policy.field_0x4;
  sVar1 = (pPVar7->properties).modified_databases._M_h._M_rehash_policy._M_next_resize;
  (__return_storage_ptr__->modified_databases)._M_h._M_rehash_policy._M_max_load_factor =
       (pPVar7->properties).modified_databases._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(__return_storage_ptr__->modified_databases)._M_h._M_rehash_policy.field_0x4 =
       uVar3;
  (__return_storage_ptr__->modified_databases)._M_h._M_rehash_policy._M_next_resize = sVar1;
  (__return_storage_ptr__->modified_databases)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::StatementProperties::CatalogIdentity>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_28._M_h,&(pPVar7->properties).modified_databases._M_h,&local_28);
  __return_storage_ptr__->always_require_rebind = (pPVar7->properties).always_require_rebind;
  bVar4 = (pPVar7->properties).allow_stream_result;
  bVar5 = (pPVar7->properties).bound_all_parameters;
  SVar6 = (pPVar7->properties).return_type;
  uVar3 = *(undefined4 *)&(pPVar7->properties).field_0x74;
  iVar2 = (pPVar7->properties).parameter_count;
  __return_storage_ptr__->requires_valid_transaction =
       (pPVar7->properties).requires_valid_transaction;
  __return_storage_ptr__->allow_stream_result = bVar4;
  __return_storage_ptr__->bound_all_parameters = bVar5;
  __return_storage_ptr__->return_type = SVar6;
  *(undefined4 *)&__return_storage_ptr__->field_0x74 = uVar3;
  __return_storage_ptr__->parameter_count = iVar2;
  return __return_storage_ptr__;
}

Assistant:

StatementProperties PreparedStatement::GetStatementProperties() {
	D_ASSERT(data);
	return data->properties;
}